

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

bool __thiscall
iDynTree::KinDynComputations::getAverageVelocityJacobian
          (KinDynComputations *this,MatrixView<double> *avgVelocityJacobian)

{
  long lVar1;
  bool bVar2;
  Index row;
  long lVar3;
  PointerType pdVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  element_type *peVar8;
  pointer peVar9;
  element_type *peVar10;
  pointer peVar11;
  long lVar12;
  type tmp;
  Matrix6x6 invLockedInertia;
  element_type *local_220 [2];
  MatrixView<double> local_210;
  MatrixView<double> local_1e0;
  undefined1 *local_1b0 [2];
  PointerType local_1a0;
  variable_if_dynamic<long,__1> local_198;
  variable_if_dynamic<long,__1> local_190;
  PointerType local_188;
  variable_if_dynamic<long,__1> local_180;
  variable_if_dynamic<long,__1> local_178;
  variable_if_dynamic<long,__1> local_168;
  variable_if_dynamic<long,__1> vStack_160;
  long local_158;
  undefined1 local_150 [288];
  
  if ((avgVelocityJacobian->m_rows == 6) &&
     (lVar7 = avgVelocityJacobian->m_cols, lVar3 = iDynTree::Model::getNrOfDOFs(),
     lVar7 == lVar3 + 6)) {
    computeRawMassMatrixAndTotalMomentum(this);
    KinDynComputationsPrivateAttributes::getRobotLockedInertia(this->pimpl);
    iDynTree::SpatialInertia::getInverse();
    pdVar4 = (PointerType)iDynTree::MatrixDynSize::data();
    lVar5 = iDynTree::MatrixDynSize::rows();
    lVar6 = iDynTree::MatrixDynSize::cols();
    lVar7 = iDynTree::Model::getNrOfDOFs();
    local_190.m_value = lVar7 + 6;
    local_198.m_value = 6;
    local_168.m_value = 0;
    vStack_160.m_value = 0;
    lVar7 = avgVelocityJacobian->m_cols;
    peVar11 = avgVelocityJacobian->m_storage;
    lVar3 = avgVelocityJacobian->m_rows;
    lVar12 = 1;
    lVar1 = lVar3;
    if (avgVelocityJacobian->m_storageOrder != ColumnMajor) {
      lVar12 = lVar7;
      lVar1 = 1;
    }
    local_1b0[0] = local_150;
    local_1a0 = pdVar4;
    local_188 = pdVar4;
    local_180.m_value = lVar5;
    local_178.m_value = lVar6;
    local_158 = lVar6;
    Eigen::Matrix<double,6,-1,0,6,-1>::
    Matrix<Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,0>>
              ((Matrix<double,6,_1,0,6,_1> *)local_220,
               (Product<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
                *)local_1b0);
    if (0 < lVar3) {
      lVar5 = 0;
      peVar8 = local_220[0];
      do {
        peVar9 = peVar11;
        peVar10 = peVar8;
        lVar6 = lVar7;
        if (0 < lVar7) {
          do {
            *peVar9 = *peVar10;
            peVar10 = peVar10 + 6;
            peVar9 = peVar9 + lVar1;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        lVar5 = lVar5 + 1;
        peVar8 = peVar8 + 1;
        peVar11 = peVar11 + lVar12;
      } while (lVar5 != lVar3);
    }
    free(local_220[0]);
    local_1e0.m_storage = avgVelocityJacobian->m_storage;
    local_1e0.m_rows = avgVelocityJacobian->m_rows;
    local_1e0.m_cols = avgVelocityJacobian->m_cols;
    local_1e0.m_storageOrder = avgVelocityJacobian->m_storageOrder;
    local_1e0.m_innerStride = avgVelocityJacobian->m_innerStride;
    local_1e0.m_outerStride = avgVelocityJacobian->m_outerStride;
    KinDynComputationsPrivateAttributes::processOnRightSideMatrixExpectingBodyFixedModelVelocity
              (this->pimpl,&local_1e0);
    local_210.m_storage = avgVelocityJacobian->m_storage;
    local_210.m_rows = avgVelocityJacobian->m_rows;
    local_210.m_cols = avgVelocityJacobian->m_cols;
    local_210.m_storageOrder = avgVelocityJacobian->m_storageOrder;
    local_210.m_innerStride = avgVelocityJacobian->m_innerStride;
    local_210.m_outerStride = avgVelocityJacobian->m_outerStride;
    KinDynComputationsPrivateAttributes::processOnLeftSideBodyFixedAvgVelocityJacobian
              (this->pimpl,&local_210);
    bVar2 = true;
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","getAverageVelocityJacobian",
               "Wrong size in input avgVelocityJacobian");
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool KinDynComputations::getAverageVelocityJacobian(MatrixView<double> avgVelocityJacobian)
{
    bool ok = (avgVelocityJacobian.rows() == 6)
        && (avgVelocityJacobian.cols() == pimpl->m_robot_model.getNrOfDOFs() + 6);

    if( !ok )
    {
        reportError("KinDynComputations",
                    "getAverageVelocityJacobian",
                    "Wrong size in input avgVelocityJacobian");
        return false;
    }

    this->computeRawMassMatrixAndTotalMomentum();

    const SpatialInertia & lockedInertia = pimpl->getRobotLockedInertia();
    Matrix6x6 invLockedInertia = lockedInertia.getInverse();

    // The first six rows of the mass matrix are the base-base average velocity jacobian
    toEigen(avgVelocityJacobian) = toEigen(invLockedInertia)*toEigen(pimpl->m_rawMassMatrix).block(0,0,6,6+pimpl->m_robot_model.getNrOfDOFs());

    // Handle the different representations
    pimpl->processOnRightSideMatrixExpectingBodyFixedModelVelocity(avgVelocityJacobian);
    pimpl->processOnLeftSideBodyFixedAvgVelocityJacobian(avgVelocityJacobian);

    return true;
}